

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

void __thiscall
SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
::insert(SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
         *this,GenericFunctionInstanceTypeRequest *key,GenericFunctionInstanceTypeResponse *value)

{
  TypeBase *pTVar1;
  FunctionData *pFVar2;
  TypeHandle *pTVar3;
  MatchData *pMVar4;
  uint uVar5;
  undefined4 uVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  Node *this_00;
  GenericFunctionInstanceTypeRequest local_68;
  
  local_68.hash = 0;
  local_68.parentType = (TypeBase *)0x0;
  local_68.function = (FunctionData *)0x0;
  local_68.arguments.head = (TypeHandle *)0x0;
  local_68.arguments.tail = (TypeHandle *)0x0;
  local_68.aliases.head = (MatchData *)0x0;
  local_68.aliases.tail = (MatchData *)0x0;
  bVar7 = GenericFunctionInstanceTypeRequest::operator==(key,&local_68);
  if (bVar7) {
    __assert_fail("key != Key()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                  ,0x3b,
                  "void SmallDenseMap<GenericFunctionInstanceTypeRequest, GenericFunctionInstanceTypeResponse, GenericFunctionInstanceTypeRequestHasher, 32>::insert(const Key &, const Value &) [Key = GenericFunctionInstanceTypeRequest, Value = GenericFunctionInstanceTypeResponse, Hasher = GenericFunctionInstanceTypeRequestHasher, N = 32]"
                 );
  }
  if (this->bucketCount <= (this->count >> 2) + this->count) {
    rehash(this);
  }
  uVar8 = this->bucketCount - 1;
  if (this->bucketCount != 0) {
    uVar10 = key->hash & uVar8;
    uVar9 = 1;
    do {
      this_00 = this->data + uVar10;
      local_68.hash = 0;
      local_68.aliases.head = (MatchData *)0x0;
      local_68.aliases.tail = (MatchData *)0x0;
      local_68.arguments.head = (TypeHandle *)0x0;
      local_68.arguments.tail = (TypeHandle *)0x0;
      local_68.parentType = (TypeBase *)0x0;
      local_68.function = (FunctionData *)0x0;
      bVar7 = GenericFunctionInstanceTypeRequest::operator==(&this_00->key,&local_68);
      if (bVar7) {
        (this_00->key).aliases.tail = (key->aliases).tail;
        uVar5 = key->hash;
        uVar6 = *(undefined4 *)&key->field_0x4;
        pTVar1 = key->parentType;
        pFVar2 = key->function;
        pTVar3 = (key->arguments).head;
        pMVar4 = (key->aliases).head;
        (this_00->key).arguments.tail = (key->arguments).tail;
        (this_00->key).aliases.head = pMVar4;
        (this_00->key).function = pFVar2;
        (this_00->key).arguments.head = pTVar3;
        (this_00->key).hash = uVar5;
        *(undefined4 *)&(this_00->key).field_0x4 = uVar6;
        (this_00->key).parentType = pTVar1;
        pMVar4 = (value->aliases).head;
        (this_00->value).functionType = value->functionType;
        (this_00->value).aliases.head = pMVar4;
        (this_00->value).aliases.tail = (value->aliases).tail;
        this->count = this->count + 1;
LAB_0017e961:
        bVar7 = false;
      }
      else {
        bVar7 = GenericFunctionInstanceTypeRequest::operator==(&this_00->key,key);
        if (bVar7) {
          (this_00->value).aliases.tail = (value->aliases).tail;
          pMVar4 = (value->aliases).head;
          (this_00->value).functionType = value->functionType;
          (this_00->value).aliases.head = pMVar4;
          goto LAB_0017e961;
        }
        uVar10 = uVar10 + uVar9 & uVar8;
        bVar7 = true;
      }
      if (!bVar7) {
        return;
      }
      bVar7 = uVar9 < this->bucketCount;
      uVar9 = uVar9 + 1;
    } while (bVar7);
  }
  __assert_fail("!\"couldn\'t insert node\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                ,0x5b,
                "void SmallDenseMap<GenericFunctionInstanceTypeRequest, GenericFunctionInstanceTypeResponse, GenericFunctionInstanceTypeRequestHasher, 32>::insert(const Key &, const Value &) [Key = GenericFunctionInstanceTypeRequest, Value = GenericFunctionInstanceTypeResponse, Hasher = GenericFunctionInstanceTypeRequestHasher, N = 32]"
               );
}

Assistant:

void insert(const Key& key, const Value& value)
	{
		// Default value is used as an empty marker
		assert(key != Key());

		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
			{
				item.key = key;
				item.value = value;

				count++;
				return;
			}

			if(item.key == key)
			{
				item.value = value;
				return;
			}

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		assert(!"couldn't insert node");
	}